

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::io::anon_unknown_0::VarintCasesWithSizes_WriteVarint64_Test::TestBody
          (VarintCasesWithSizes_WriteVarint64_Test *this)

{
  size_t *lhs;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  ParamType *pPVar3;
  ParamType *pPVar4;
  int64_t iVar5;
  uint8_t *ptr;
  ulong uVar6;
  ulong uVar7;
  pointer *__ptr_1;
  char *pcVar8;
  char *in_R9;
  pointer *__ptr;
  int size;
  void *data;
  CodedOutputStream coded_output;
  ArrayOutputStream output;
  AssertHelper local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_b8;
  undefined1 local_b0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  AssertHelper local_90;
  undefined1 local_88 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78 [2];
  ArrayOutputStream *local_58;
  undefined2 local_50;
  bool local_4e;
  bool local_4d;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  int64_t local_40;
  ArrayOutputStream local_38;
  
  pPVar3 = testing::
           WithParamInterface<std::tuple<google::protobuf::io::(anonymous_namespace)::VarintCase,_int>_>
           ::GetParam();
  pPVar4 = testing::
           WithParamInterface<std::tuple<google::protobuf::io::(anonymous_namespace)::VarintCase,_int>_>
           ::GetParam();
  ArrayOutputStream::ArrayOutputStream
            (&local_38,&io::(anonymous_namespace)::CodedStreamTest::buffer_,0x10000,
             (pPVar4->
             super__Tuple_impl<0UL,_google::protobuf::io::(anonymous_namespace)::VarintCase,_int>).
             super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl);
  local_4e = (bool)(CodedOutputStream::default_serialization_deterministic_ & 1);
  local_50._0_1_ = false;
  local_50._1_1_ = false;
  local_4d = false;
  local_88 = (undefined1  [8])local_78;
  local_80 = local_78;
  local_58 = &local_38;
  local_48 = local_78;
  local_40 = ArrayOutputStream::ByteCount(&local_38);
  bVar2 = ArrayOutputStream::Next(&local_38,(void **)local_b0,(int *)&local_c8);
  if (bVar2 && 0 < (int)(uint)local_c8.data_) {
    paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)((long)local_b0 + -0x10);
    if ((int)(uint)local_c8.data_ < 0x11) {
      paVar1 = local_78;
    }
    local_88 = (undefined1  [8])(paVar1->_M_local_buf + (uint)local_c8.data_);
    local_80 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_b0;
    local_48 = local_78;
    if (0x10 < (int)(uint)local_c8.data_) {
      local_80 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
      local_48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_b0;
    }
  }
  uVar7 = (pPVar3->
          super__Tuple_impl<0UL,_google::protobuf::io::(anonymous_namespace)::VarintCase,_int>).
          super__Head_base<0UL,_google::protobuf::io::(anonymous_namespace)::VarintCase,_false>.
          _M_head_impl.value;
  if ((ulong)local_88 <= local_48) {
    local_48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)EpsCopyOutputStream::EnsureSpaceFallback
                            ((EpsCopyOutputStream *)local_88,
                             (uint8_t *)&local_48->_M_allocated_capacity);
  }
  uVar6 = uVar7;
  if (0x7f < uVar7) {
    do {
      local_48->_M_local_buf[0] = (byte)uVar6 | 0x80;
      uVar7 = uVar6 >> 7;
      local_48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)((long)local_48 + 1);
      bVar2 = 0x3fff < uVar6;
      uVar6 = uVar7;
    } while (bVar2);
  }
  local_48->_M_local_buf[0] = (byte)uVar7;
  local_48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)((long)local_48 + 1);
  bVar2 = CodedOutputStream::HadError((CodedOutputStream *)local_88);
  local_c8.data_._0_4_ = CONCAT31(local_c8.data_._1_3_,!bVar2);
  local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_b0,(internal *)&local_c8,(AssertionResult *)"coded_output.HadError()"
               ,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,0x125,(char *)local_b0);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_b0 != (undefined1  [8])&local_a0) {
      operator_delete((void *)local_b0,local_a0._M_allocated_capacity + 1);
    }
    if (local_b8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_b8._M_head_impl + 8))();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  iVar5 = EpsCopyOutputStream::ByteCount((EpsCopyOutputStream *)local_88,(uint8_t *)local_48);
  lhs = &(pPVar3->
         super__Tuple_impl<0UL,_google::protobuf::io::(anonymous_namespace)::VarintCase,_int>).
         super__Head_base<0UL,_google::protobuf::io::(anonymous_namespace)::VarintCase,_false>.
         _M_head_impl.size;
  local_c8.data_._0_4_ = (int)iVar5 - (int)local_40;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_b0,"kVarintCases_case.size","coded_output.ByteCount()",lhs,
             (int *)&local_c8);
  if (local_b0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c8);
    if (local_a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar8 = (local_a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,0x127,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
    if ((long *)CONCAT44(local_c8.data_._4_4_,(uint)local_c8.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_c8.data_._4_4_,(uint)local_c8.data_) + 8))();
    }
  }
  if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a8,local_a8);
  }
  CodedOutputStream::~CodedOutputStream((CodedOutputStream *)local_88);
  local_b0 = (undefined1  [8])ArrayOutputStream::ByteCount(&local_38);
  testing::internal::CmpHelperEQ<unsigned_long,long>
            ((internal *)local_88,"kVarintCases_case.size","output.ByteCount()",lhs,(long *)local_b0
            );
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b0);
    if (local_80 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      pcVar8 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar8 = (char *)local_80->_M_allocated_capacity;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,0x12a,pcVar8);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (local_b0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_b0 + 8))();
    }
  }
  if (local_80 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
  }
  local_b0 = (undefined1  [8])((ulong)local_b0 & 0xffffffff00000000);
  local_c8.data_._0_4_ =
       memcmp(&io::(anonymous_namespace)::CodedStreamTest::buffer_,
              &(pPVar3->
               super__Tuple_impl<0UL,_google::protobuf::io::(anonymous_namespace)::VarintCase,_int>)
               .
               super__Head_base<0UL,_google::protobuf::io::(anonymous_namespace)::VarintCase,_false>
              ,*lhs);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_88,"0",
             "memcmp(buffer_, kVarintCases_case.bytes, kVarintCases_case.size)",(int *)local_b0,
             (int *)&local_c8);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b0);
    if (local_80 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      pcVar8 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar8 = (char *)local_80->_M_allocated_capacity;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,300,pcVar8);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (local_b0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_b0 + 8))();
    }
  }
  if (local_80 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
  }
  return;
}

Assistant:

TEST_P(VarintCasesWithSizes, WriteVarint64) {
  const VarintCase& kVarintCases_case = std::get<0>(GetParam());
  const int& kBlockSizes_case = std::get<1>(GetParam());
  ArrayOutputStream output(buffer_, sizeof(buffer_), kBlockSizes_case);

  {
    CodedOutputStream coded_output(&output);

    coded_output.WriteVarint64(kVarintCases_case.value);
    EXPECT_FALSE(coded_output.HadError());

    EXPECT_EQ(kVarintCases_case.size, coded_output.ByteCount());
  }

  EXPECT_EQ(kVarintCases_case.size, output.ByteCount());
  EXPECT_EQ(0,
            memcmp(buffer_, kVarintCases_case.bytes, kVarintCases_case.size));
}